

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O2

void __thiscall QPixmap::QPixmap(QPixmap *this,QPixmap *pixmap)

{
  totally_ordered_wrapper<QPlatformPixmap_*> tVar1;
  bool bVar2;
  QExplicitlySharedDataPointer<QPlatformPixmap> *this_00;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  QPixmap local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_0077be48;
  (this->data).d.ptr = (QPlatformPixmap *)0x0;
  this_00 = &this->data;
  bVar2 = qt_pixmap_thread_test();
  if (bVar2) {
    if ((pixmap->super_QPaintDevice).painters == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QExplicitlySharedDataPointer<QPlatformPixmap>::operator=(this_00,&pixmap->data);
        return;
      }
    }
    else {
      local_48 = 0;
      uStack_40 = 0xffffffffffffffff;
      copy(&local_38,(EVP_PKEY_CTX *)pixmap,(EVP_PKEY_CTX *)&local_48);
      tVar1.ptr = (this_00->d).ptr;
      (this_00->d).ptr = (QPlatformPixmap *)local_38.data.d.ptr;
      local_38.data.d.ptr =
           (totally_ordered_wrapper<QPlatformPixmap_*>)
           (totally_ordered_wrapper<QPlatformPixmap_*>)tVar1.ptr;
      ~QPixmap(&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QExplicitlySharedDataPointer<QPlatformPixmap>::reset(this_00,(QPlatformPixmap *)0x0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap::QPixmap(const QPixmap &pixmap)
    : QPaintDevice()
{
    if (!qt_pixmap_thread_test()) {
        doInit(0, 0, QPlatformPixmap::PixmapType);
        return;
    }
    if (pixmap.paintingActive()) {                // make a deep copy
        pixmap.copy().swap(*this);
    } else {
        data = pixmap.data;
    }
}